

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

void __thiscall QTableWidget::setHorizontalHeaderLabels(QTableWidget *this,QStringList *labels)

{
  int iVar1;
  QTableModel *this_00;
  QTableWidgetItem *item;
  ulong uVar2;
  long lVar3;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QTableModel *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
  local_58._forAlignment = -NAN;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  iVar1 = (**(code **)(*(long *)this_00 + 0x80))(this_00);
  if (0 < iVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      if ((ulong)(labels->d).size <= uVar2) break;
      if (((ulong)(this_00->horizontalHeaderItems).d.size <= uVar2) ||
         (item = (this_00->horizontalHeaderItems).d.ptr[uVar2], item == (QTableWidgetItem *)0x0)) {
        item = QTableModel::createItem(this_00);
        setHorizontalHeaderItem(this,(int)uVar2,item);
      }
      ::QVariant::QVariant
                ((QVariant *)&local_58,(QString *)((long)&(((labels->d).ptr)->d).d + lVar3));
      (*item->_vptr_QTableWidgetItem[4])(item,0,&local_58);
      ::QVariant::~QVariant((QVariant *)&local_58);
      uVar2 = uVar2 + 1;
      local_58._forAlignment = -NAN;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      iVar1 = (**(code **)(*(long *)this_00 + 0x80))(this_00,&local_58);
      lVar3 = lVar3 + 0x18;
    } while ((long)uVar2 < (long)iVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidget::setHorizontalHeaderLabels(const QStringList &labels)
{
    Q_D(QTableWidget);
    QTableModel *model = d->tableModel();
    QTableWidgetItem *item = nullptr;
    for (int i = 0; i < model->columnCount() && i < labels.size(); ++i) {
        item = model->horizontalHeaderItem(i);
        if (!item) {
            item = model->createItem();
            setHorizontalHeaderItem(i, item);
        }
        item->setText(labels.at(i));
    }
}